

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

uint32_t __thiscall
ddd::DaTrie<true,_true,_true>::xcheck_in_block_
          (DaTrie<true,_true,_true> *this,Edge *edge,uint32_t block_pos,
          vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *blocks)

{
  bool bVar1;
  uint uVar2;
  size_t sVar3;
  const_reference pvVar4;
  byte *pbVar5;
  DaTrie<true,_true,_true> *in_RCX;
  uint in_EDX;
  Edge *in_RSI;
  uint32_t base;
  uint32_t node_pos;
  uint32_t head;
  uint32_t in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffc8;
  uint32_t local_30;
  uint32_t base_00;
  
  sVar3 = Edge::size(in_RSI);
  if (sVar3 == 0) {
    __assert_fail("0 < edge.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                  ,0x37a,
                  "uint32_t ddd::DaTrie<true, true, true>::xcheck_in_block_(const Edge &, uint32_t, const std::vector<BlockLink> &) const [WithBLM = true, WithNLM = true, Prefix = true]"
                 );
  }
  pvVar4 = std::vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>::operator[]
                     ((vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *)in_RCX,
                      (ulong)in_EDX);
  uVar2 = pvVar4->num_emps;
  sVar3 = Edge::size(in_RSI);
  if (sVar3 <= uVar2) {
    pvVar4 = std::vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>::operator[]
                       ((vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *)in_RCX,
                        (ulong)in_EDX);
    local_30 = pvVar4->head;
    base_00 = local_30;
    do {
      pbVar5 = Edge::begin(in_RSI);
      uVar2 = local_30 ^ *pbVar5;
      bVar1 = is_target_(in_RCX,base_00,(Edge *)CONCAT44(uVar2,in_stack_ffffffffffffffc8));
      if (bVar1) {
        return uVar2;
      }
      local_30 = next_((DaTrie<true,_true,_true> *)CONCAT44(local_30,in_stack_ffffffffffffffb0),
                       in_stack_ffffffffffffffac);
    } while (local_30 != base_00);
  }
  return 0xffffffff;
}

Assistant:

uint32_t xcheck_in_block_(const Edge& edge, uint32_t block_pos,
                            const std::vector<BlockLink>& blocks) const {
    assert(0 < edge.size());

    if (blocks[block_pos].num_emps < edge.size()) {
      return NOT_FOUND;
    }

    auto head = blocks[block_pos].head;
    auto node_pos = head;

    do {
      auto base = node_pos ^*edge.begin();
      if (is_target_(base, edge)) {
        return base;
      }
    } while ((node_pos = next_(node_pos)) != head);

    return NOT_FOUND;
  }